

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int fts3EvalPhraseMergeToken(Fts3Table *pTab,Fts3Phrase *p,int iToken,char *pList,int nList)

{
  byte bVar1;
  int iVar2;
  sqlite3_int64 sVar3;
  int iVar4;
  char *pcVar5;
  sqlite3_int64 *pVal;
  long lVar6;
  uint bDescIdx;
  char *p_00;
  int iVar7;
  char *pcVar8;
  char **pp;
  char *pcVar9;
  uint bDescIdx_00;
  int local_a0;
  int local_9c;
  char *p_1;
  char *p1;
  sqlite3_int64 i1;
  Fts3Phrase *local_80;
  sqlite3_int64 iPrev;
  int local_70;
  int local_6c;
  char *local_68;
  char *local_60;
  char *local_58;
  char *p2;
  sqlite3_int64 i2;
  char *local_40;
  char *local_38;
  
  local_70 = iToken;
  if (pList == (char *)0x0) {
    sqlite3_free((p->doclist).aAll);
    (p->doclist).aAll = (char *)0x0;
    (p->doclist).nAll = 0;
  }
  else {
    iVar4 = p->iDoclistToken;
    if (iVar4 < 0) {
      (p->doclist).aAll = pList;
      (p->doclist).nAll = nList;
    }
    else {
      pcVar8 = (p->doclist).aAll;
      if (pcVar8 != (char *)0x0) {
        iVar2 = (p->doclist).nAll;
        local_9c = iVar4 - iToken;
        p_00 = pList;
        iVar7 = iVar2;
        if (iVar4 < iToken) {
          local_9c = iToken - iVar4;
          p_00 = pcVar8;
          pcVar8 = pList;
          iVar7 = nList;
          nList = iVar2;
        }
        bVar1 = pTab->bDescIdx;
        i1 = 0;
        i2 = 0;
        iPrev = 0;
        local_a0 = 0;
        pcVar5 = pcVar8;
        p1 = p_00;
        local_80 = p;
        p2 = pcVar8;
        if ((bVar1 == 0) ||
           (pcVar5 = (char *)sqlite3_malloc64((long)iVar7 + 10), pcVar5 != (char *)0x0)) {
          local_58 = p_00 + nList;
          pcVar9 = pcVar8 + iVar7;
          p_1 = pcVar5;
          local_68 = pcVar8;
          local_60 = p_00;
          local_40 = pcVar5;
          fts3GetDeltaVarint3(&p1,local_58,0,&i1);
          bDescIdx = 0;
          pVal = &i2;
          pcVar8 = pcVar9;
          pp = &p2;
          while( true ) {
            fts3GetDeltaVarint3(pp,pcVar8,bDescIdx,pVal);
            pcVar5 = local_40;
            sVar3 = iPrev;
            bDescIdx = (uint)bVar1;
            if ((p1 == (char *)0x0) || (p2 == (char *)0x0)) break;
            bDescIdx_00 = (uint)bVar1;
            lVar6 = -(i1 - i2);
            if (bDescIdx_00 == 0) {
              lVar6 = i1 - i2;
            }
            if (lVar6 == 0) {
              local_38 = p_1;
              local_6c = local_a0;
              fts3PutDeltaVarint3(&p_1,bDescIdx_00,&iPrev,&local_a0,i1);
              iVar4 = fts3PoslistPhraseMerge(&p_1,local_9c,0,1,&p1,&p2);
              if (iVar4 == 0) {
                p_1 = local_38;
                local_a0 = local_6c;
                iPrev = sVar3;
              }
              fts3GetDeltaVarint3(&p1,local_58,bDescIdx_00,&i1);
              pVal = &i2;
              pcVar8 = pcVar9;
              pp = &p2;
            }
            else if (lVar6 < 0) {
              fts3PoslistCopy((char **)0x0,&p1);
              pVal = &i1;
              pcVar8 = local_58;
              pp = &p1;
            }
            else {
              fts3PoslistCopy((char **)0x0,&p2);
              pVal = &i2;
              pcVar8 = pcVar9;
              pp = &p2;
            }
          }
          iVar7 = (int)p_1 - (int)local_40;
          iVar4 = 0;
          p_00 = local_60;
          pcVar8 = local_68;
          if (bDescIdx != 0) {
            sqlite3_free(local_68);
            p_00 = local_60;
            pcVar8 = pcVar5;
          }
        }
        else {
          iVar4 = 7;
        }
        p = local_80;
        sqlite3_free(p_00);
        (p->doclist).aAll = pcVar8;
        (p->doclist).nAll = iVar7;
        goto LAB_001a6a64;
      }
      sqlite3_free(pList);
    }
  }
  iVar4 = 0;
LAB_001a6a64:
  if (p->iDoclistToken < local_70) {
    p->iDoclistToken = local_70;
  }
  return iVar4;
}

Assistant:

static int fts3EvalPhraseMergeToken(
  Fts3Table *pTab,                /* FTS Table pointer */
  Fts3Phrase *p,                  /* Phrase to merge pList/nList into */
  int iToken,                     /* Token pList/nList corresponds to */
  char *pList,                    /* Pointer to doclist */
  int nList                       /* Number of bytes in pList */
){
  int rc = SQLITE_OK;
  assert( iToken!=p->iDoclistToken );

  if( pList==0 ){
    sqlite3_free(p->doclist.aAll);
    p->doclist.aAll = 0;
    p->doclist.nAll = 0;
  }

  else if( p->iDoclistToken<0 ){
    p->doclist.aAll = pList;
    p->doclist.nAll = nList;
  }

  else if( p->doclist.aAll==0 ){
    sqlite3_free(pList);
  }

  else {
    char *pLeft;
    char *pRight;
    int nLeft;
    int nRight;
    int nDiff;

    if( p->iDoclistToken<iToken ){
      pLeft = p->doclist.aAll;
      nLeft = p->doclist.nAll;
      pRight = pList;
      nRight = nList;
      nDiff = iToken - p->iDoclistToken;
    }else{
      pRight = p->doclist.aAll;
      nRight = p->doclist.nAll;
      pLeft = pList;
      nLeft = nList;
      nDiff = p->iDoclistToken - iToken;
    }

    rc = fts3DoclistPhraseMerge(
        pTab->bDescIdx, nDiff, pLeft, nLeft, &pRight, &nRight
    );
    sqlite3_free(pLeft);
    p->doclist.aAll = pRight;
    p->doclist.nAll = nRight;
  }

  if( iToken>p->iDoclistToken ) p->iDoclistToken = iToken;
  return rc;
}